

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O3

int Abc_ResCheckNonStrict(char *Pattern,int nVars,int nBits)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar8 = 1 << ((char)nBits - 1U & 0x1f);
  if (nVars < 1) {
    return 0;
  }
  uVar2 = 1 << ((byte)nVars & 0x1f);
  uVar5 = 1;
  if (1 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  iVar3 = 0;
  iVar4 = 0;
  do {
    uVar7 = 0;
    if (nVars != 0x1f) {
      uVar6 = 0;
      uVar11 = 0;
      uVar12 = 0;
      do {
        cVar1 = Pattern[uVar6];
        uVar7 = uVar6;
        if ((1 << ((byte)iVar4 & 0x1f) & (uint)uVar6) == 0) {
          iVar10 = (int)uVar12;
          if (0 < iVar10) {
            uVar9 = 0;
            do {
              if (Abc_ResCheckNonStrict::Pat0[uVar9] == cVar1) goto LAB_002402dd;
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
          }
          Abc_ResCheckNonStrict::Pat0[iVar10] = cVar1;
          if (iVar8 <= iVar10) break;
          uVar12 = (ulong)(iVar10 + 1);
        }
        else {
          iVar10 = (int)uVar11;
          if (0 < iVar10) {
            uVar9 = 0;
            do {
              if (Abc_ResCheckNonStrict::Pat1[uVar9] == cVar1) goto LAB_002402dd;
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          Abc_ResCheckNonStrict::Pat1[iVar10] = cVar1;
          if (iVar8 <= iVar10) break;
          uVar11 = (ulong)(iVar10 + 1);
        }
LAB_002402dd:
        uVar6 = uVar6 + 1;
        uVar7 = uVar5;
      } while (uVar6 != uVar5);
    }
    iVar3 = iVar3 + (uint)((uint)uVar7 == uVar2);
    iVar4 = iVar4 + 1;
    if (iVar4 == nVars) {
      return iVar3;
    }
  } while( true );
}

Assistant:

int Abc_ResCheckNonStrict( char Pattern[], int nVars, int nBits )
{
    static char Pat0[256], Pat1[256];
    int v, m, nPats0, nPats1, nNumber = (1 << (nBits - 1));
    int Result = 0;
    for ( v = 0; v < nVars; v++ )
    {
        nPats0 = nPats1 = 0;
        for ( m = 0; m < (1<<nVars); m++ )
        {
            if ( (m & (1 << v)) == 0 )
            {
                if ( Abc_ResCheckUnique( Pat0, nPats0, Pattern[m] ) )
                {
                    Pat0[ nPats0++ ] = Pattern[m];
                    if ( nPats0 > nNumber )
                        break;
                }
            }
            else
            {
                if ( Abc_ResCheckUnique( Pat1, nPats1, Pattern[m] ) )
                {
                    Pat1[ nPats1++ ] = Pattern[m];
                    if ( nPats1 > nNumber )
                        break;
                }
            }
        }
        if ( m == (1<<nVars) )
            Result++;
    }
    return Result;
}